

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O3

void __thiscall
wasm::OrderedFixedStorage<unsigned_int,_3UL>::erase
          (OrderedFixedStorage<unsigned_int,_3UL> *this,uint *x)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar1 = (this->super_FixedStorageBase<unsigned_int,_3UL>).used;
  if (uVar1 != 0) {
    uVar2 = 1;
    do {
      if ((this->super_FixedStorageBase<unsigned_int,_3UL>).storage._M_elems[uVar2 - 1] == *x) {
        for (; uVar2 < uVar1; uVar2 = uVar2 + 1) {
          (this->super_FixedStorageBase<unsigned_int,_3UL>).storage._M_elems[uVar2 - 1] =
               (this->super_FixedStorageBase<unsigned_int,_3UL>).storage._M_elems[uVar2];
        }
        (this->super_FixedStorageBase<unsigned_int,_3UL>).used = uVar1 - 1;
        return;
      }
      bVar3 = uVar2 != uVar1;
      uVar2 = uVar2 + 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void erase(const T& x) {
    for (size_t i = 0; i < this->used; i++) {
      if (this->storage[i] == x) {
        // We found the item; move things backwards and shrink.
        for (size_t j = i + 1; j < this->used; j++) {
          this->storage[j - 1] = this->storage[j];
        }
        this->used--;
        return;
      }
    }
  }